

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__simple_alpha_unweight_4ch(float *encode_buffer,int width_times_channels)

{
  float fVar1;
  float fVar2;
  __m128 ia;
  __m128 i;
  float alpha;
  float *end_output;
  float *encode;
  int width_times_channels_local;
  float *encode_buffer_local;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  end_output = encode_buffer;
  do {
    fVar1 = end_output[3];
    if (7.523164e-37 <= fVar1) {
      fVar2 = 1.0 / fVar1;
      local_48 = (float)*(undefined8 *)end_output;
      fStack_44 = (float)((ulong)*(undefined8 *)end_output >> 0x20);
      fStack_40 = (float)*(undefined8 *)(end_output + 2);
      fStack_3c = (float)((ulong)*(undefined8 *)(end_output + 2) >> 0x20);
      ia[3] = fStack_44 * fVar2;
      ia[2] = local_48 * fVar2;
      i[1] = fStack_3c * fVar2;
      i[0] = fStack_40 * fVar2;
      *(undefined8 *)end_output = ia._8_8_;
      *(undefined8 *)(end_output + 2) = i._0_8_;
      end_output[3] = fVar1;
    }
    end_output = end_output + 4;
  } while (end_output < encode_buffer + width_times_channels);
  return;
}

Assistant:

static void stbir__simple_alpha_unweight_4ch( float * encode_buffer, int width_times_channels )
{
  float STBIR_SIMD_STREAMOUT_PTR(*) encode = encode_buffer;
  float const * end_output = encode_buffer + width_times_channels;

  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float alpha = encode[3];

#ifdef STBIR_SIMD
    stbir__simdf i,ia;
    STBIR_SIMD_NO_UNROLL(encode);
    if ( alpha >= stbir__small_float )
    {
      stbir__simdf_load1frep4( ia, 1.0f / alpha );
      stbir__simdf_load( i, encode );
      stbir__simdf_mult( i, i, ia );
      stbir__simdf_store( encode, i );
      encode[3] = alpha;
    }
#else
    if ( alpha >= stbir__small_float )
    {
      float ialpha = 1.0f / alpha;
      encode[0] *= ialpha;
      encode[1] *= ialpha;
      encode[2] *= ialpha;
    }
#endif
    encode += 4;
  } while ( encode < end_output );
}